

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoldingSet.cpp
# Opt level: O2

void __thiscall llvm::FoldingSetIteratorImpl::advance(FoldingSetIteratorImpl *this)

{
  void **ppvVar1;
  FoldingSetNode *NextInBucketPtr;
  
  NextInBucketPtr = (FoldingSetNode *)this->NodePtr->NextInFoldingSetBucket;
  if (NextInBucketPtr == (FoldingSetNode *)0x0 || ((ulong)NextInBucketPtr & 1) != 0) {
    ppvVar1 = GetBucketPtr(NextInBucketPtr);
    do {
      do {
        ppvVar1 = ppvVar1 + 1;
        NextInBucketPtr = (FoldingSetNode *)*ppvVar1;
      } while (NextInBucketPtr == (FoldingSetNode *)0x0);
    } while ((NextInBucketPtr != (FoldingSetNode *)0xffffffffffffffff) &&
            (NextInBucketPtr == (FoldingSetNode *)0x0 || ((ulong)NextInBucketPtr & 1) != 0));
  }
  this->NodePtr = NextInBucketPtr;
  return;
}

Assistant:

void FoldingSetIteratorImpl::advance() {
  // If there is another link within this bucket, go to it.
  void *Probe = NodePtr->getNextInBucket();

  if (FoldingSetNode *NextNodeInBucket = GetNextPtr(Probe))
    NodePtr = NextNodeInBucket;
  else {
    // Otherwise, this is the last link in this bucket.
    void **Bucket = GetBucketPtr(Probe);

    // Skip to the next non-null non-self-cycle bucket.
    do {
      ++Bucket;
    } while (*Bucket != reinterpret_cast<void*>(-1) &&
             (!*Bucket || !GetNextPtr(*Bucket)));

    NodePtr = static_cast<FoldingSetNode*>(*Bucket);
  }
}